

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O2

void cf_hmac_drbg_gen_additional(cf_hmac_drbg *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  void *__dest;
  void *local_330;
  cf_hmac_ctx local_308;
  
  local_330 = addnl;
  while( true ) {
    if (nout == 0) {
      return;
    }
    uVar1 = 0x10000;
    if (nout < 0x10000) {
      uVar1 = nout;
    }
    if (ctx->reseed_counter == 0) break;
    uVar2 = uVar1;
    __dest = out;
    if (naddnl != 0) {
      hmac_drbg_update(ctx,local_330,naddnl,(void *)0x0,0,(void *)0x0,0);
    }
    for (; uVar2 != 0; uVar2 = uVar2 - __n) {
      memcpy(&local_308,&ctx->hmac,0x2d8);
      cf_hmac_update(&local_308,ctx,((ctx->hmac).hash)->hashsz);
      cf_hmac_finish(&local_308,ctx->V);
      __n = ((ctx->hmac).hash)->hashsz;
      if (uVar2 <= __n) {
        __n = uVar2;
      }
      memcpy(__dest,ctx,__n);
      __dest = (void *)((long)__dest + __n);
    }
    hmac_drbg_update(ctx,local_330,naddnl,(void *)0x0,0,(void *)0x0,0);
    ctx->reseed_counter = ctx->reseed_counter + 1;
    out = (void *)((long)out + uVar1);
    nout = nout - uVar1;
    naddnl = 0;
    local_330 = (void *)0x0;
  }
  abort();
}

Assistant:

void cf_hmac_drbg_gen_additional(cf_hmac_drbg *ctx,
                                 const void *addnl, size_t naddnl,
                                 void *out, size_t nout)
{
  uint8_t *bout = out;

  while (nout != 0)
  {
    size_t take = MIN(MAX_DRBG_GENERATE, nout);
    hmac_drbg_generate(ctx, addnl, naddnl, bout, take);
    bout += take;
    nout -= take;

    /* Add additional data only once. */
    addnl = NULL;
    naddnl = 0;
  }
}